

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.cpp
# Opt level: O0

void Diligent::ProcessUBVariable(ShaderCodeVariableDescX *Var,Uint32 BaseOffset)

{
  Char *Message;
  undefined1 local_48 [8];
  string msg;
  ShaderCodeVariableDescX *Member;
  anon_class_1_0_00000001 local_15;
  Uint32 i;
  ShaderCodeVariableDescX *pSStack_10;
  Uint32 BaseOffset_local;
  ShaderCodeVariableDescX *Var_local;
  
  i = BaseOffset;
  pSStack_10 = Var;
  ShaderCodeVariableDescX::
  ProcessMembers<Diligent::ProcessUBVariable(Diligent::ShaderCodeVariableDescX&,unsigned_int)::__0>
            (Var,&local_15);
  for (Member._4_4_ = 0; Member._4_4_ < (pSStack_10->super_ShaderCodeVariableDesc).NumMembers;
      Member._4_4_ = Member._4_4_ + 1) {
    msg.field_2._8_8_ = ShaderCodeVariableDescX::GetMember(pSStack_10,(ulong)Member._4_4_);
    ProcessUBVariable((ShaderCodeVariableDescX *)msg.field_2._8_8_,
                      (pSStack_10->super_ShaderCodeVariableDesc).Offset);
  }
  if ((pSStack_10->super_ShaderCodeVariableDesc).Offset < i) {
    FormatString<char[26],char[25]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Var.Offset >= BaseOffset",(char (*) [25])pSStack_10);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"ProcessUBVariable",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x130);
    std::__cxx11::string::~string((string *)local_48);
  }
  (pSStack_10->super_ShaderCodeVariableDesc).Offset =
       (pSStack_10->super_ShaderCodeVariableDesc).Offset - i;
  return;
}

Assistant:

static void ProcessUBVariable(ShaderCodeVariableDescX& Var, Uint32 BaseOffset)
{
    // Re-sort by offset
    Var.ProcessMembers(
        [](auto& Members) {
            std::sort(Members.begin(), Members.end(),
                      [](const ShaderCodeVariableDescX& Var1, const ShaderCodeVariableDescX& Var2) {
                          return Var1.Offset < Var2.Offset;
                      });
        });

    for (Uint32 i = 0; i < Var.NumMembers; ++i)
    {
        auto& Member = Var.GetMember(i);
        ProcessUBVariable(Member, Var.Offset);
    }
    VERIFY_EXPR(Var.Offset >= BaseOffset);
    // Convert global offset to relative
    Var.Offset -= BaseOffset;
}